

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O2

int __thiscall
SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
::Decode(SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
         *this,int max_count,uint64_t *out)

{
  uint *puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pvVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  Elem EVar8;
  pointer this_00;
  pointer pMVar9;
  pointer pMVar10;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *p_Var11;
  undefined8 uVar12;
  Elem extraout_EDX;
  Elem extraout_EDX_00;
  undefined8 extraout_RDX;
  size_t extraout_RDX_00;
  size_t __n;
  size_t extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  ulong uVar13;
  long lVar14;
  pointer __p;
  ulong uVar15;
  pointer pMVar16;
  iterator __begin0;
  RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4> *this_01;
  pointer puVar17;
  pointer puVar18;
  size_t i;
  ulong uVar19;
  _Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
  *p_Var20;
  pointer pMVar21;
  int iVar22;
  long lVar23;
  long in_FS_OFFSET;
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l;
  undefined7 in_stack_fffffffffffffcb8;
  byte bVar24;
  uint local_328;
  uint local_324;
  long local_318;
  long local_310;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> all_syndromes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roots;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  stack;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_258 [21];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&all_syndromes,
             (long)(this->m_syndromes).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_syndromes).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 1);
  for (uVar19 = 0;
      puVar17 = (this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar19 < (ulong)((long)(this->m_syndromes).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar17 >> 2);
      uVar19 = uVar19 + 1) {
    all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar19 * 2] = puVar17[uVar19];
    uVar6 = RecLinTrans<unsigned_int,6,6,5,5,5,5>::Map<BitsInt<unsigned_int,32>,0>
                      ((RecLinTrans<unsigned_int,6,6,5,5,5,5> *)(anonymous_namespace)::SQR_TABLE_32,
                       all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19]);
    all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar19 * 2 + 1] = uVar6;
  }
  stack.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stack.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,
             ((ulong)((long)all_syndromes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)all_syndromes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) >> 1) + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&roots,((ulong)((long)all_syndromes.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)all_syndromes.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2) >> 1) + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&tmp,((ulong)((long)all_syndromes.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)all_syndromes.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2) >> 1) + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,1);
  *local_58._M_impl.super__Vector_impl_data._M_start = 1;
  pMVar16 = (pointer)&DAT_00000001;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&roots,1);
  *roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  p_Var20 = (_Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
             *)((long)all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2);
  if ((ulong)p_Var20 >> 0x36 == 0) {
    if (all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_00 = (pointer)0x0;
      pMVar21 = (pointer)0x0;
    }
    else {
      this_00 = std::
                _Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
                ::_M_allocate(p_Var20,(size_t)pMVar16);
      pMVar21 = this_00 + (long)p_Var20;
      stack.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
      stack.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_00;
      stack.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pMVar21;
    }
    bVar24 = 1;
    local_310 = -0x200;
    local_318 = 0xc;
    local_328 = 1;
    local_324 = local_328;
    for (uVar19 = 0;
        pvVar4 = stack.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        puVar17 = all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        uVar19 != (long)all_syndromes.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)all_syndromes.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2; uVar19 = uVar19 + 1) {
      if ((pointer)stack.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish == pMVar21) {
        lVar23 = (long)pMVar21 - (long)this_00;
        if (lVar23 == 0x7ffffffffffffe00) {
          stack.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
          stack.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pMVar21;
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_008f1a2e;
          std::__throw_length_error("vector::_M_realloc_insert");
          goto LAB_008f187b;
        }
        __p = (pointer)(lVar23 >> 9);
        pMVar9 = __p;
        if (pMVar21 == this_00) {
          pMVar9 = (pointer)&DAT_00000001;
        }
        p_Var20 = (_Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
                   *)((long)(__p->table).trans.table + (long)(pMVar9->table).trans.table);
        if ((_Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
             *)0x3ffffffffffffe < p_Var20) {
          p_Var20 = (_Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
                     *)0x3fffffffffffff;
        }
        if (CARRY8((ulong)pMVar9,(ulong)__p)) {
          p_Var20 = (_Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
                     *)0x3fffffffffffff;
        }
        pMVar10 = std::
                  _Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
                  ::_M_allocate(p_Var20,(size_t)pMVar16);
        RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>::Build<&LFSR<BitsInt<unsigned_int,32>,141u>::Call>
                  ((RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4> *)(lVar23 + (long)pMVar10),
                   puVar17[uVar19]);
        __n = extraout_RDX_00;
        pMVar16 = pMVar10;
        for (pMVar9 = this_00; pMVar9 != pMVar21; pMVar9 = pMVar9 + 1) {
          memcpy(pMVar16,pMVar9,0x200);
          __n = extraout_RDX_01;
          pMVar16 = pMVar16 + 1;
        }
        std::
        _Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
        ::_M_deallocate((_Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
                         *)this_00,__p,__n);
        pMVar21 = pMVar10 + (long)p_Var20;
        uVar12 = extraout_RDX_02;
        this_00 = pMVar10;
        stack.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pMVar16 + 1);
      }
      else {
        __p = (pointer)(ulong)all_syndromes.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar19];
        RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>::Build<&LFSR<BitsInt<unsigned_int,32>,141u>::Call>
                  ((RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4> *)
                   stack.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar19]);
        uVar12 = extraout_RDX;
        stack.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)&pvVar4[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar6 = all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19];
      this_01 = (RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4> *)
                ((long)(this_00->table).trans.table + local_310);
      uVar13 = 1;
      while( true ) {
        EVar8 = (Elem)uVar12;
        lVar23 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58._M_impl.super__Vector_impl_data._M_start;
        uVar15 = lVar23 >> 2;
        if (uVar15 <= uVar13) break;
        __p = (pointer)(ulong)local_58._M_impl.super__Vector_impl_data._M_start[uVar13];
        uVar7 = RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>::Map<BitsInt<unsigned_int,32>,0>
                          (this_01,local_58._M_impl.super__Vector_impl_data._M_start[uVar13]);
        uVar6 = uVar6 ^ uVar7;
        uVar13 = uVar13 + 1;
        this_01 = this_01 + -0x200;
        uVar12 = extraout_RDX_03;
      }
      pMVar16 = __p;
      if (uVar6 != 0) {
        lVar14 = (long)roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start;
        if ((bVar24 & 1) == 0) {
          local_324 = InvExtGCD<unsigned_int,BitsInt<unsigned_int,32>,32,141u>(local_328);
          lVar23 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_58._M_impl.super__Vector_impl_data._M_start;
          EVar8 = extraout_EDX;
        }
        lVar14 = uVar15 + (lVar14 >> 2);
        uVar13 = (lVar23 >> 1) - 2;
        bVar24 = uVar19 < uVar13;
        if (uVar13 <= uVar19) {
          lVar23 = (long)(((int)uVar19 - (int)lVar14) + 3);
          if ((ulong)(long)max_count <
              (lVar23 + ((long)roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2)) - 1U) {
            p_Var11 = &local_2f0;
            stack.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
            stack.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pMVar21;
            goto LAB_008f15d0;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (&tmp,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,
                     ((long)roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2) + lVar23);
          EVar8 = extraout_EDX_00;
        }
        EVar8 = anon_unknown.dwarf_2e77177::
                Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                ::Mul((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                       *)(ulong)uVar6,local_324,EVar8);
        pMVar16 = (pointer)(ulong)EVar8;
        RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>::Build<&LFSR<BitsInt<unsigned_int,32>,141u>::Call>
                  ((RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4> *)local_258,EVar8);
        for (uVar15 = 0;
            puVar3 = roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
            puVar2 = roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish,
            puVar18 = roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
            puVar17 = tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
            uVar15 < (ulong)((long)roots.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)roots.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2);
            uVar15 = uVar15 + 1) {
          pMVar16 = (pointer)(ulong)roots.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar15];
          uVar7 = RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>::Map<BitsInt<unsigned_int,32>,0>
                            ((RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4> *)local_258,
                             roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar15]);
          puVar1 = (uint *)((long)local_58._M_impl.super__Vector_impl_data._M_start +
                           uVar15 * 4 + ((local_318 + lVar14 * -4) * 0x40000000 >> 0x1e));
          *puVar1 = *puVar1 ^ uVar7;
        }
        if (uVar13 <= uVar19) {
          roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
          roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = puVar18;
          tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar2;
          tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = puVar3;
          pMVar16 = (pointer)puVar17;
          local_328 = uVar6;
        }
      }
      local_310 = local_310 + 0x200;
      local_318 = local_318 + 4;
    }
    p_Var11 = &local_2f0;
    stack.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
    stack.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pMVar21;
    if ((local_58._M_impl.super__Vector_impl_data._M_finish !=
         local_58._M_impl.super__Vector_impl_data._M_start) &&
       (local_58._M_impl.super__Vector_impl_data._M_finish[-1] != 0)) {
      local_2f0._M_impl.super__Vector_impl_data._M_start =
           local_58._M_impl.super__Vector_impl_data._M_start;
      local_2f0._M_impl.super__Vector_impl_data._M_finish =
           local_58._M_impl.super__Vector_impl_data._M_finish;
      local_2f0._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
      p_Var11 = &local_58;
    }
LAB_008f15d0:
    (p_Var11->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
    (p_Var11->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
    (p_Var11->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    p_Var11 = &roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(p_Var11);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
    std::
    vector<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
    ::~vector((vector<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
               *)&stack);
    lVar23 = (long)local_2f0._M_impl.super__Vector_impl_data._M_finish -
             (long)local_2f0._M_impl.super__Vector_impl_data._M_start >> 2;
    iVar22 = -1;
    if (lVar23 != 0) {
      if (lVar23 == 1) {
        iVar22 = 0;
      }
      else if ((int)lVar23 <= max_count + 1) {
        std::
        __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ();
        EVar8 = this->m_basis;
        local_258[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_258[0]._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
        local_258[0]._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
        if (((local_2f0._M_impl.super__Vector_impl_data._M_finish ==
              local_2f0._M_impl.super__Vector_impl_data._M_start) || (EVar8 == 0)) ||
           ((long)local_2f0._M_impl.super__Vector_impl_data._M_finish -
            (long)local_2f0._M_impl.super__Vector_impl_data._M_start == 4)) {
          local_258[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_258[0]._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
          local_258[0]._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
          roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          puVar17 = (uint *)0x0;
          puVar18 = (uint *)0x0;
        }
        else {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_258,
                     ((long)local_2f0._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_2f0._M_impl.super__Vector_impl_data._M_start >> 2) - 1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2f0);
          __l._M_len = 1;
          __l._M_array = (iterator)&local_58;
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::vector(&stack,__l,(allocator_type *)&tmp);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
          bVar5 = RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                            (&stack,0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      local_258,false,0,EVar8,
                             (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                              *)CONCAT17(bVar24,in_stack_fffffffffffffcb8));
          if ((bVar5) &&
             (((long)local_2f0._M_impl.super__Vector_impl_data._M_finish -
               (long)local_2f0._M_impl.super__Vector_impl_data._M_start >> 2) + -1 ==
              (long)local_258[0]._M_impl.super__Vector_impl_data._M_finish -
              (long)local_258[0]._M_impl.super__Vector_impl_data._M_start >> 2)) {
            roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = local_258[0]._M_impl.super__Vector_impl_data._M_start
            ;
            roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_258[0]._M_impl.super__Vector_impl_data._M_finish;
            roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_258[0]._M_impl.super__Vector_impl_data._M_end_of_storage;
            p_Var11 = local_258;
            puVar17 = local_258[0]._M_impl.super__Vector_impl_data._M_start;
            puVar18 = local_258[0]._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            puVar17 = (uint *)0x0;
            puVar18 = (uint *)0x0;
          }
          (p_Var11->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
          (p_Var11->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
          (p_Var11->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::~vector(&stack);
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(local_258);
        if ((long)puVar18 - (long)puVar17 == 0) {
          iVar22 = -1;
        }
        else {
          iVar22 = (int)((ulong)((long)puVar18 - (long)puVar17) >> 2);
          for (; puVar17 != puVar18; puVar17 = puVar17 + 1) {
            *out = (ulong)*puVar17;
            out = out + 1;
          }
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&roots.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2f0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return iVar22;
    }
  }
  else {
LAB_008f187b:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar12 = std::__throw_length_error("vector::reserve");
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&stack);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(local_258);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2f0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&all_syndromes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(uVar12);
      }
    }
  }
LAB_008f1a2e:
  __stack_chk_fail();
}

Assistant:

int Decode(int max_count, uint64_t* out) const override
    {
        auto all_syndromes = ReconstructAllSyndromes(m_syndromes, m_field);
        auto poly = BerlekampMassey(all_syndromes, max_count, m_field);
        if (poly.size() == 0) return -1;
        if (poly.size() == 1) return 0;
        if ((int)poly.size() > 1 + max_count) return -1;
        std::reverse(poly.begin(), poly.end());
        auto roots = FindRoots(poly, m_basis, m_field);
        if (roots.size() == 0) return -1;

        for (const auto& root : roots) {
            *(out++) = m_field.ToUint64(root);
        }
        return static_cast<int>(roots.size());
    }